

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

size_t __thiscall miniscript::Node<XOnlyPubKey>::CalcScriptLen(Node<XOnlyPubKey> *this)

{
  pointer psVar1;
  pointer psVar2;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *sub;
  pointer psVar3;
  size_t sVar4;
  Type sub0typ;
  long lVar5;
  long in_FS_OFFSET;
  
  psVar2 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sub0typ.m_flags = 0;
  sVar4 = 0;
  psVar1 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (psVar3 = psVar1; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    sVar4 = sVar4 + ((psVar3->
                     super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->scriptlen;
  }
  lVar5 = (long)psVar2 - (long)psVar1;
  if (lVar5 != 0) {
    sub0typ.m_flags =
         (((psVar1->
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->typ).m_flags;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    sVar4 = miniscript::internal::ComputeScriptLen
                      (this->fragment,sub0typ,sVar4,this->k,lVar5 >> 4,
                       (long)(this->keys).
                             super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->keys).
                             super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                             super__Vector_impl_data._M_start >> 5,this->m_script_ctx);
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t CalcScriptLen() const {
        size_t subsize = 0;
        for (const auto& sub : subs) {
            subsize += sub->ScriptSize();
        }
        static constexpr auto NONE_MST{""_mst};
        Type sub0type = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        return internal::ComputeScriptLen(fragment, sub0type, subsize, k, subs.size(), keys.size(), m_script_ctx);
    }